

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O3

unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
__thiscall
TasGrid::GridReaderVersion5<TasGrid::GridLocalPolynomial>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridLocalPolynomial> *this,AccelerationContext *acc,
          istream *is)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  TypeOneDRule TVar6;
  undefined8 *puVar7;
  int num_entries;
  unsigned_long num_entries_00;
  int *num_entries_01;
  pointer *__ptr;
  iterator __begin0;
  pointer piVar8;
  int *piVar9;
  pointer piVar10;
  bool bVar11;
  int v;
  int v_4;
  undefined1 local_78 [8];
  pointer piStack_70;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_48;
  
  puVar7 = (undefined8 *)operator_new(0x150);
  puVar7[1] = acc;
  puVar7[2] = 0;
  puVar7[3] = 0;
  *(undefined4 *)(puVar7 + 4) = 0;
  puVar7[5] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  puVar7[8] = 0;
  *(undefined4 *)(puVar7 + 9) = 0;
  puVar7[10] = 0;
  puVar7[0xb] = 0;
  puVar7[0xc] = 0;
  puVar7[0xd] = 0;
  puVar7[0xe] = 0;
  puVar7[0xf] = 0;
  puVar7[0x10] = 0;
  puVar7[0x11] = 0;
  *puVar7 = &PTR__GridLocalPolynomial_001f7610;
  *(undefined4 *)(puVar7 + 0x12) = 1;
  memset((int *)((long)puVar7 + 0x94),0,0x9c);
  puVar7[0x27] = 0;
  puVar7[0x28] = 0;
  puVar7[0x29] = 0;
  *(undefined8 **)this = puVar7;
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  *(undefined4 *)(puVar7 + 2) = local_78._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  *(undefined4 *)((long)puVar7 + 0x14) = local_78._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  *(undefined4 *)(puVar7 + 0x12) = local_78._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  *(int *)((long)puVar7 + 0x94) = local_78._0_4_;
  TVar6 = IO::readRule<TasGrid::IO::mode_ascii_type>(is);
  if (*(int *)(puVar7 + 0x12) == 0) {
    num_entries_00 = 0;
  }
  else {
    num_entries_00 = 1;
    if (TVar6 - rule_localp0 < 3) {
      num_entries_00 = (unsigned_long)*(uint *)(&DAT_001cd05c + (ulong)(TVar6 - rule_localp0) * 4);
    }
  }
  *(int *)(puVar7 + 0x26) = (int)num_entries_00;
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  if (local_78._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_78,is);
    *(int *)(puVar7 + 4) = (int)piStack_70;
    puVar7[3] = local_78;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar7 + 5),
               (vector<int,_std::allocator<int>_> *)&local_68);
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  if (local_78._0_4_ != 0) {
    piVar8 = (pointer)(long)*(int *)((long)puVar7 + 0x14);
    piVar10 = (pointer)(long)*(int *)(puVar7 + 4);
    IO::readVector<TasGrid::IO::mode_ascii_type,double,unsigned_long>
              (&local_48,(IO *)is,(istream *)((long)piVar10 * (long)piVar8),num_entries_00);
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    puVar7[0x13] = piVar8;
    puVar7[0x14] = piVar10;
    local_78 = (undefined1  [8])piVar8;
    piStack_70 = piVar10;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(puVar7 + 0x15),&local_68);
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  if (local_78._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_78,is);
    *(int *)(puVar7 + 9) = (int)piStack_70;
    puVar7[8] = local_78;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar7 + 10),
               (vector<int,_std::allocator<int>_> *)&local_68);
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  iVar1 = *(int *)(puVar7 + 0x26);
  ::std::istream::operator>>((istream *)is,(int *)local_78);
  if (local_78._0_4_ != 0) {
    bVar11 = (iVar1 - 1U & 0xfffffffd) != 0;
    piVar8 = (pointer)(long)*(int *)(puVar7 + 4);
    piVar10 = (pointer)(long)(*(int *)(puVar7 + 2) << bVar11);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              ((vector<int,_std::allocator<int>_> *)&local_48,(IO *)is,
               (istream *)((long)piVar8 * (long)piVar10),
               CONCAT71((int7)(num_entries_00 >> 8),bVar11));
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    puVar7[0x18] = piVar10;
    puVar7[0x19] = piVar8;
    local_78 = (undefined1  [8])piVar10;
    piStack_70 = piVar8;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar7 + 0x1a),
               (vector<int,_std::allocator<int>_> *)&local_68);
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  num_entries_01 = (int *)(puVar7 + 4);
  if (puVar7[5] == puVar7[6]) {
    num_entries_01 = (int *)(puVar7 + 9);
  }
  iVar1 = *num_entries_01;
  ::std::istream::operator>>((istream *)is,(int *)&local_48);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,
             (long)(int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,(allocator_type *)&local_48);
  pvVar3 = (void *)puVar7[0x1d];
  lVar4 = puVar7[0x1f];
  puVar7[0x1d] = local_78;
  puVar7[0x1e] = piStack_70;
  puVar7[0x1f] = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_78 = (undefined1  [8])0x0;
  piStack_70 = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,lVar4 - (long)pvVar3);
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_78);
    }
  }
  piVar9 = (int *)puVar7[0x1d];
  piVar5 = (int *)puVar7[0x1e];
  if (piVar5 != piVar9) {
    do {
      ::std::istream::operator>>((istream *)is,piVar9);
      piVar9 = piVar9 + 1;
    } while (piVar9 != piVar5);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              ((vector<int,_std::allocator<int>_> *)local_78,(IO *)is,(istream *)((long)iVar1 + 1),
               (unsigned_long)num_entries_01);
    num_entries = (int)num_entries_01;
    pvVar3 = (void *)puVar7[0x20];
    lVar4 = puVar7[0x22];
    puVar7[0x20] = local_78;
    puVar7[0x21] = piStack_70;
    puVar7[0x22] = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_78 = (undefined1  [8])0x0;
    piStack_70 = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,lVar4 - (long)pvVar3);
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78,
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_78);
      }
    }
    uVar2 = *(uint *)(puVar7[0x20] + (long)iVar1 * 4);
    if ((int)uVar2 < 1) {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                ((vector<int,_std::allocator<int>_> *)local_78,(IO *)is,(istream *)0x1,num_entries);
    }
    else {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                ((vector<int,_std::allocator<int>_> *)local_78,(IO *)is,(istream *)(ulong)uVar2,
                 num_entries);
    }
    pvVar3 = (void *)puVar7[0x23];
    lVar4 = puVar7[0x25];
    puVar7[0x23] = local_78;
    puVar7[0x24] = piStack_70;
    puVar7[0x25] = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_78 = (undefined1  [8])0x0;
    piStack_70 = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,lVar4 - (long)pvVar3);
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78,
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_78);
      }
    }
  }
  if (0 < *(int *)((long)puVar7 + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)local_78,is);
    puVar7[0xd] = local_78;
    puVar7[0xe] = piStack_70;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(puVar7 + 0xf),&local_68);
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return (__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridLocalPolynomial> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridLocalPolynomial> grid = Utils::make_unique<GridLocalPolynomial>(acc);

            grid->num_dimensions = IO::readNumber<iomode, int>(is);
            grid->num_outputs = IO::readNumber<iomode, int>(is);
            grid->order = IO::readNumber<iomode, int>(is);
            grid->top_level = IO::readNumber<iomode, int>(is);
            TypeOneDRule rule = IO::readRule<iomode>(is);
            grid->effective_rule = RuleLocal::getEffectiveRule(grid->order, rule);

            if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
            if (std::is_same<iomode, IO::mode_ascii_type>::value){ // backwards compatible: surpluses and needed, or needed and surpluses
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
            }else{
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
            }
            int max_parents = [&]()->int {
                    switch(grid->effective_rule) {
                        case RuleLocal::erule::pwc: return RuleLocal::getMaxNumParents<RuleLocal::erule::pwc>();
                        case RuleLocal::erule::localp: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp>();
                        case RuleLocal::erule::semilocalp: return RuleLocal::getMaxNumParents<RuleLocal::erule::semilocalp>();
                        case RuleLocal::erule::localp0: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp0>();
                        default: // case RuleLocal::erule::localpb:
                            return RuleLocal::getMaxNumParents<RuleLocal::erule::localpb>();
                    };
                }();

            if (IO::readFlag<iomode>(is))
                grid->parents = IO::readData2D<iomode, int>(is, max_parents * grid->num_dimensions, grid->points.getNumIndexes());

            size_t num_points = (size_t) ((grid->points.empty()) ? grid->needed.getNumIndexes() : grid->points.getNumIndexes());
            grid->roots = std::vector<int>((size_t) IO::readNumber<iomode, int>(is));
            if (grid->roots.size() > 0){
                IO::readVector<iomode>(is, grid->roots);
                grid->pntr = IO::readVector<iomode, int>(is, num_points + 1);
                if (grid->pntr[num_points] > 0){
                    grid->indx = IO::readVector<iomode, int>(is, grid->pntr[num_points]);
                }else{
                    grid->indx = IO::readVector<iomode, int>(is, 1);
                }
            }

            if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        return grid;
    }